

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_parse_function_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::ParseFunctionGenerator::GenerateLengthDelim
          (ParseFunctionGenerator *this,Formatter *format,FieldDescriptor *field)

{
  FieldDescriptor FVar1;
  undefined1 *puVar2;
  string *psVar3;
  bool bVar4;
  Descriptor *pDVar5;
  FieldDescriptor *this_00;
  LogMessage *pLVar6;
  EnumDescriptor *pEVar7;
  long lVar8;
  Options *in_RCX;
  Options *options;
  char *pcVar9;
  string enum_type;
  undefined1 local_90 [56];
  FieldDescriptor *local_58;
  string local_50;
  char *local_30;
  
  if ((~(byte)field[1] & 0x60) == 0) {
    if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
      local_90._0_8_ = FieldDescriptor::TypeOnceInit;
      local_50._M_dataplus._M_p = (pointer)field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)local_90,
                 (FieldDescriptor **)&local_50);
    }
    if (0xfffffffb < (byte)field[2] - 0xd) goto LAB_002b9ecc;
    if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
      local_90._0_8_ = FieldDescriptor::TypeOnceInit;
      local_50._M_dataplus._M_p = (pointer)field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)local_90,
                 (FieldDescriptor **)&local_50);
    }
    if ((field[2] != (FieldDescriptor)0xe) || (*(char *)(*(long *)(field + 0x10) + 0x3a) == '\x03'))
    {
      if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
        local_90._0_8_ = FieldDescriptor::TypeOnceInit;
        local_50._M_dataplus._M_p = (pointer)field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)local_90,
                   (FieldDescriptor **)&local_50);
      }
      local_90._0_8_ = DeclaredTypeMethodName((uint)(byte)field[2]);
      Formatter::operator()
                (format,
                 "ptr = ::$proto_ns$::internal::Packed$1$Parser($msg$_internal_mutable_$name$(), ptr, ctx);\n"
                 ,(char **)local_90);
      return;
    }
    pEVar7 = FieldDescriptor::enum_type(field);
    QualifiedClassName_abi_cxx11_
              ((string *)local_90,(cpp *)pEVar7,(EnumDescriptor *)this->options_,in_RCX);
    if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
      local_50._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
      local_58 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)&local_50,
                 &local_58);
    }
    local_30 = DeclaredTypeMethodName((uint)(byte)field[2]);
    local_50._M_dataplus._M_p._0_4_ = *(undefined4 *)(field + 4);
    Formatter::operator()
              (format,
               "ptr = ::$proto_ns$::internal::Packed$1$Parser<$unknown_fields_type$>($msg$_internal_mutable_$name$(), ptr, ctx, $2$_IsValid, &$msg$_internal_metadata_, $3$);\n"
               ,&local_30,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
               (int *)&local_50);
  }
  else {
LAB_002b9ecc:
    if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
      local_90._0_8_ = FieldDescriptor::TypeOnceInit;
      local_50._M_dataplus._M_p = (pointer)field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)local_90,
                 (FieldDescriptor **)&local_50);
    }
    FVar1 = field[2];
    if (FVar1 == (FieldDescriptor)0xc) {
      bVar4 = false;
LAB_002ba04a:
      GenerateStrings(this,format,field,bVar4);
      return;
    }
    if (FVar1 != (FieldDescriptor)0xb) {
      if (FVar1 != (FieldDescriptor)0x9) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_90,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_parse_function_generator.cc"
                   ,0x339);
        pLVar6 = internal::LogMessage::operator<<
                           ((LogMessage *)local_90,
                            "Illegal combination for length delimited wiretype ");
        pLVar6 = internal::LogMessage::operator<<(pLVar6," filed type is ");
        if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
          local_50._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
          local_58 = field;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)&local_50,
                     &local_58);
        }
        pLVar6 = internal::LogMessage::operator<<(pLVar6,(uint)(byte)field[2]);
        internal::LogFinisher::operator=((LogFinisher *)&local_50,pLVar6);
        internal::LogMessage::~LogMessage((LogMessage *)local_90);
        return;
      }
      bVar4 = true;
      goto LAB_002ba04a;
    }
    if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
      local_90._0_8_ = FieldDescriptor::TypeOnceInit;
      local_50._M_dataplus._M_p = (pointer)field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)local_90,
                 (FieldDescriptor **)&local_50);
    }
    if ((field[2] == (FieldDescriptor)0xb) &&
       (bVar4 = FieldDescriptor::is_map_message_type(field), bVar4)) {
      pDVar5 = FieldDescriptor::message_type(field);
      local_90._0_8_ = local_90 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"value","");
      this_00 = Descriptor::FindFieldByName(pDVar5,(ConstStringParam)local_90);
      if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
        operator_delete((void *)local_90._0_8_);
      }
      if (this_00 == (FieldDescriptor *)0x0) {
        in_RCX = (Options *)0x2f4;
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_90,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_parse_function_generator.cc"
                   ,0x2f4);
        pLVar6 = internal::LogMessage::operator<<((LogMessage *)local_90,"CHECK failed: val: ");
        internal::LogFinisher::operator=((LogFinisher *)&local_50,pLVar6);
        internal::LogMessage::~LogMessage((LogMessage *)local_90);
      }
      if (*(once_flag **)(this_00 + 0x18) != (once_flag *)0x0) {
        local_50._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
        local_58 = this_00;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(this_00 + 0x18),(_func_void_FieldDescriptor_ptr **)&local_50,
                   &local_58);
      }
      if ((this_00[2] != (FieldDescriptor)0xe) ||
         (*(char *)(*(long *)(field + 0x10) + 0x3a) == '\x03')) {
        pcVar9 = "ptr = ctx->ParseMessage(&$msg$$name$_, ptr);\n";
        goto LAB_002ba2e6;
      }
      pEVar7 = FieldDescriptor::enum_type(this_00);
      QualifiedClassName_abi_cxx11_(&local_50,(cpp *)pEVar7,(EnumDescriptor *)this->options_,in_RCX)
      ;
      local_58 = (FieldDescriptor *)CONCAT44(local_58._4_4_,*(undefined4 *)(field + 4));
      Formatter::operator()
                (format,
                 "auto object = ::$proto_ns$::internal::InitEnumParseWrapper<$unknown_fields_type$>(&$msg$$name$_, $1$_IsValid, $2$, &$msg$_internal_metadata_);\nptr = ctx->ParseMessage(&object, ptr);\n"
                 ,&local_50,(int *)&local_58);
      psVar3 = &local_50;
      goto LAB_002ba2c6;
    }
    bVar4 = IsLazy(field,this->options_,this->scc_analyzer_);
    if (bVar4) {
      FVar1 = field[1];
      options = (Options *)CONCAT71((int7)((ulong)in_RCX >> 8),FVar1);
      lVar8 = *(long *)(field + 0x28);
      if ((lVar8 == 0 || ((byte)FVar1 & 0x10) == 0) ||
         ((*(int *)(lVar8 + 4) == 1 &&
          (lVar8 == 0 || (*(byte *)(*(long *)(lVar8 + 0x20) + 1) & 2) != 0)))) {
        bVar4 = HasHasbit(field);
        if (bVar4) {
          pcVar9 = "_Internal::set_has_$name$(&$has_bits$);\nauto* lazy_field = &$msg$$name$_;\n";
        }
        else {
          pcVar9 = "auto* lazy_field = &$msg$$name$_;\n";
        }
        Formatter::operator()<>(format,pcVar9);
      }
      else {
        if (((byte)FVar1 & 0x10) == 0) {
          lVar8 = 0;
        }
        Formatter::operator()
                  (format,
                   "if (!$msg$_internal_has_$name$()) {\n  $msg$clear_$1$();\n  $msg$$1$_.$name$_ = ::$proto_ns$::Arena::CreateMessage<\n      ::$proto_ns$::internal::LazyField>($msg$GetArenaForAllocation());\n  $msg$set_has_$name$();\n}\nauto* lazy_field = $msg$$1$_.$name$_;\n"
                   ,*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     (lVar8 + 8));
      }
      FieldMessageTypeName_abi_cxx11_
                ((string *)local_90,(cpp *)field,(FieldDescriptor *)this->options_,options);
      Formatter::operator()
                (format,
                 "::$proto_ns$::internal::LazyFieldParseHelper<\n  ::$proto_ns$::internal::LazyField> parse_helper(\n    $1$::default_instance(),\n    $msg$GetArenaForAllocation(), lazy_field);\nptr = ctx->ParseMessage(&parse_helper, ptr);\n"
                 ,(string *)local_90);
    }
    else {
      bVar4 = IsImplicitWeakField(field,this->options_,this->scc_analyzer_);
      if (bVar4) {
        if ((~(byte)field[1] & 0x60) != 0) {
          pcVar9 = "ptr = ctx->ParseMessage(_Internal::mutable_$name$($this$), ptr);\n";
LAB_002ba2e6:
          Formatter::operator()<>(format,pcVar9);
          return;
        }
        pDVar5 = FieldDescriptor::message_type(field);
        QualifiedDefaultInstanceName_abi_cxx11_
                  ((string *)local_90,(cpp *)pDVar5,(Descriptor *)this->options_,in_RCX);
        Formatter::operator()
                  (format,
                   "ptr = ctx->ParseMessage($msg$$name$_.AddWeak(reinterpret_cast<const ::$proto_ns$::MessageLite*>($1$ptr_)), ptr);\n"
                   ,(string *)local_90);
      }
      else {
        bVar4 = IsWeak(field,this->options_);
        if (!bVar4) {
          pcVar9 = "ptr = ctx->ParseMessage($msg$_internal_$mutable_field$(), ptr);\n";
          goto LAB_002ba2e6;
        }
        pDVar5 = FieldDescriptor::message_type(field);
        QualifiedDefaultInstanceName_abi_cxx11_
                  ((string *)local_90,(cpp *)pDVar5,(Descriptor *)this->options_,in_RCX);
        local_50._M_dataplus._M_p._0_4_ = *(undefined4 *)(field + 4);
        Formatter::operator()
                  (format,
                   "{\n  auto* default_ = &reinterpret_cast<const Message&>($1$);\n  ptr = ctx->ParseMessage($msg$_weak_field_map_.MutableMessage($2$, default_), ptr);\n}\n"
                   ,(string *)local_90,(int *)&local_50);
      }
    }
  }
  psVar3 = (string *)local_90;
LAB_002ba2c6:
  puVar2 = *(undefined1 **)((psVar3->field_2)._M_local_buf + -0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2 == &psVar3->field_2) {
    return;
  }
  operator_delete(puVar2);
  return;
}

Assistant:

void ParseFunctionGenerator::GenerateLengthDelim(Formatter& format,
                                                 const FieldDescriptor* field) {
  if (field->is_packable()) {
    if (field->type() == FieldDescriptor::TYPE_ENUM &&
        !HasPreservingUnknownEnumSemantics(field)) {
      std::string enum_type = QualifiedClassName(field->enum_type(), options_);
      format(
          "ptr = "
          "::$proto_ns$::internal::Packed$1$Parser<$unknown_fields_type$>("
          "$msg$_internal_mutable_$name$(), ptr, ctx, $2$_IsValid, "
          "&$msg$_internal_metadata_, $3$);\n",
          DeclaredTypeMethodName(field->type()), enum_type, field->number());
    } else {
      format(
          "ptr = ::$proto_ns$::internal::Packed$1$Parser("
          "$msg$_internal_mutable_$name$(), ptr, ctx);\n",
          DeclaredTypeMethodName(field->type()));
    }
  } else {
    auto field_type = field->type();
    switch (field_type) {
      case FieldDescriptor::TYPE_STRING:
        GenerateStrings(format, field, true /* utf8 */);
        break;
      case FieldDescriptor::TYPE_BYTES:
        GenerateStrings(format, field, false /* utf8 */);
        break;
      case FieldDescriptor::TYPE_MESSAGE: {
        if (field->is_map()) {
          const FieldDescriptor* val =
              field->message_type()->FindFieldByName("value");
          GOOGLE_CHECK(val);
          if (val->type() == FieldDescriptor::TYPE_ENUM &&
              !HasPreservingUnknownEnumSemantics(field)) {
            format(
                "auto object = "
                "::$proto_ns$::internal::InitEnumParseWrapper<"
                "$unknown_fields_type$>(&$msg$$name$_, $1$_IsValid, "
                "$2$, &$msg$_internal_metadata_);\n"
                "ptr = ctx->ParseMessage(&object, ptr);\n",
                QualifiedClassName(val->enum_type(), options_),
                field->number());
          } else {
            format("ptr = ctx->ParseMessage(&$msg$$name$_, ptr);\n");
          }
        } else if (IsLazy(field, options_, scc_analyzer_)) {
          if (field->real_containing_oneof()) {
            format(
                "if (!$msg$_internal_has_$name$()) {\n"
                "  $msg$clear_$1$();\n"
                "  $msg$$1$_.$name$_ = ::$proto_ns$::Arena::CreateMessage<\n"
                "      ::$proto_ns$::internal::LazyField>("
                "$msg$GetArenaForAllocation());\n"
                "  $msg$set_has_$name$();\n"
                "}\n"
                "auto* lazy_field = $msg$$1$_.$name$_;\n",
                field->containing_oneof()->name());
          } else if (HasHasbit(field)) {
            format(
                "_Internal::set_has_$name$(&$has_bits$);\n"
                "auto* lazy_field = &$msg$$name$_;\n");
          } else {
            format("auto* lazy_field = &$msg$$name$_;\n");
          }
          format(
              "::$proto_ns$::internal::LazyFieldParseHelper<\n"
              "  ::$proto_ns$::internal::LazyField> parse_helper(\n"
              "    $1$::default_instance(),\n"
              "    $msg$GetArenaForAllocation(), lazy_field);\n"
              "ptr = ctx->ParseMessage(&parse_helper, ptr);\n",
              FieldMessageTypeName(field, options_));
        } else if (IsImplicitWeakField(field, options_, scc_analyzer_)) {
          if (!field->is_repeated()) {
            format(
                "ptr = ctx->ParseMessage(_Internal::mutable_$name$($this$), "
                "ptr);\n");
          } else {
            format(
                "ptr = ctx->ParseMessage($msg$$name$_.AddWeak("
                "reinterpret_cast<const ::$proto_ns$::MessageLite*>($1$ptr_)"
                "), ptr);\n",
                QualifiedDefaultInstanceName(field->message_type(), options_));
          }
        } else if (IsWeak(field, options_)) {
          format(
              "{\n"
              "  auto* default_ = &reinterpret_cast<const Message&>($1$);\n"
              "  ptr = ctx->ParseMessage($msg$_weak_field_map_.MutableMessage("
              "$2$, default_), ptr);\n"
              "}\n",
              QualifiedDefaultInstanceName(field->message_type(), options_),
              field->number());
        } else {
          format(
              "ptr = ctx->ParseMessage($msg$_internal_$mutable_field$(), "
              "ptr);\n");
        }
        break;
      }
      default:
        GOOGLE_LOG(FATAL) << "Illegal combination for length delimited wiretype "
                   << " filed type is " << field->type();
    }
  }
}